

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O1

bool __thiscall
soul::SourceCodeOperations::reparse
          (SourceCodeOperations *this,CompileMessageList *messageList,CodeLocation *code)

{
  Type TVar1;
  SourceCodeText *pSVar2;
  SourceCodeText *o;
  pointer pCVar3;
  pointer pCVar4;
  Namespace *pNVar5;
  pointer pCVar6;
  pool_ref<soul::AST::ModuleBase> *m;
  pointer ppVar7;
  long in_FS_OFFSET;
  bool bVar8;
  CompileMessageHandler handler;
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  local_80;
  CodeLocation local_68;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  undefined8 local_38;
  
  clear(this);
  pSVar2 = (code->sourceCode).object;
  if (pSVar2 != (SourceCodeText *)0x0) {
    (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
  }
  o = (this->source).sourceCode.object;
  (this->source).sourceCode.object = pSVar2;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  (this->source).location.data = (code->location).data;
  local_40 = std::
             _Function_handler<void_(const_soul::CompileMessageGroup_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_CompileMessageList.cpp:200:30)>
             ::_M_invoke;
  local_58._8_8_ = 0;
  local_48 = std::
             _Function_handler<void_(const_soul::CompileMessageGroup_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_CompileMessageList.cpp:200:30)>
             ::_M_manager;
  local_38 = *(undefined8 *)(in_FS_OFFSET + -8);
  *(_Any_data **)(in_FS_OFFSET + -8) = &local_58;
  local_58._M_unused._M_object = messageList;
  pNVar5 = AST::createRootNamespace(&this->allocator);
  (this->topLevelNamespace).object = pNVar5;
  pSVar2 = (code->sourceCode).object;
  (code->sourceCode).object = (SourceCodeText *)0x0;
  local_68.location.data = (code->location).data;
  pNVar5 = (this->topLevelNamespace).object;
  local_68.sourceCode.object = pSVar2;
  if (pNVar5 == (Namespace *)0x0) {
    throwInternalCompilerError("object != nullptr","operator*",0x3b);
  }
  Compiler::parseTopLevelDeclarations(&local_80,&this->allocator,&local_68,pNVar5);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar2);
  for (ppVar7 = local_80.
                super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar7 != local_80.
                super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar7 = ppVar7 + 1) {
    recurseFindingModules(this,ppVar7->object);
  }
  if (local_80.
      super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.
                    super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.
                          super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.
                          super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  CompileMessageHandler::~CompileMessageHandler((CompileMessageHandler *)&local_58);
  pCVar3 = (messageList->messages).
           super__Vector_base<soul::CompileMessage,_std::allocator<soul::CompileMessage>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar4 = (messageList->messages).
           super__Vector_base<soul::CompileMessage,_std::allocator<soul::CompileMessage>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar8 = pCVar3 != pCVar4;
  if (bVar8) {
    TVar1 = pCVar3->type;
    while ((TVar1 & ~internalCompilerError) != error) {
      pCVar6 = pCVar3 + 1;
      bVar8 = pCVar6 != pCVar4;
      if (pCVar6 == pCVar4) break;
      TVar1 = pCVar3[1].type;
      pCVar3 = pCVar6;
    }
  }
  return (bool)(bVar8 ^ 1);
}

Assistant:

bool SourceCodeOperations::reparse (CompileMessageList& messageList, CodeLocation code)
{
    clear();
    source = code;

    try
    {
        CompileMessageHandler handler (messageList);
        topLevelNamespace = AST::createRootNamespace (allocator);

        for (auto& m : Compiler::parseTopLevelDeclarations (allocator, std::move (code), *topLevelNamespace))
            recurseFindingModules (m);
    }
    catch (AbortCompilationException)
    {
        clear();
    }

    return ! messageList.hasErrors();
}